

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_srl(DisasContext_conflict13 *s,DisasOps *o)

{
  tcg_gen_shr_i64_s390x(s->uc->tcg_ctx,o->out,o->in1,o->in2);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_srl(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_shr_i64(tcg_ctx, o->out, o->in1, o->in2);
    return DISAS_NEXT;
}